

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

int Ga2_ManCheckNodesAnd(Gia_Man_t *p,Vec_Int_t *vNodes)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vNodes_local;
  Gia_Man_t *p_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vNodes);
    bVar3 = false;
    if (local_2c < iVar1) {
      iVar1 = Vec_IntEntry(vNodes,local_2c);
      pGStack_28 = Gia_ManObj(p,iVar1);
      bVar3 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    pGVar2 = Gia_ObjFanin0(pGStack_28);
    if (((-1 < *(long *)pGVar2) && (iVar1 = Gia_ObjFaninC0(pGStack_28), iVar1 != 0)) ||
       ((pGVar2 = Gia_ObjFanin1(pGStack_28), -1 < *(long *)pGVar2 &&
        (iVar1 = Gia_ObjFaninC1(pGStack_28), iVar1 != 0)))) {
      return 0;
    }
    local_2c = local_2c + 1;
  }
  return 1;
}

Assistant:

int Ga2_ManCheckNodesAnd( Gia_Man_t * p, Vec_Int_t * vNodes )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        if ( (!Gia_ObjFanin0(pObj)->fPhase && Gia_ObjFaninC0(pObj)) || 
             (!Gia_ObjFanin1(pObj)->fPhase && Gia_ObjFaninC1(pObj)) )
            return 0;
    return 1;
}